

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

void stack_restore_add(int saved_size,atom a)

{
  atom a_00;
  int saved_size_local;
  atom a_local;
  
  stack_size = (size_t)saved_size;
  if (stack_size < stack_capacity >> 2) {
    stack_capacity = stack_size << 1;
    stack = (atom *)realloc(stack,stack_size << 5);
  }
  a_00._4_4_ = 0;
  a_00.type = a.type;
  a_00.value.number = a.value.number;
  stack_add(a_00);
  return;
}

Assistant:

void stack_restore_add(int saved_size, atom a) {
	stack_size = saved_size;
	/* if there is waste of memory, realloc */
	if (stack_size < stack_capacity / 4) {
		stack_capacity = stack_size * 2;
		stack = realloc(stack, stack_capacity * sizeof(atom));
	}
	stack_add(a);
}